

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,WriteToEndpoint *w)

{
  int iVar1;
  WriteToEndpoint *pWVar2;
  OutputEndpointRef *pOVar3;
  EndpointDetails *pEVar4;
  ArrayElementRef *pAVar5;
  pool_ptr<soul::AST::OutputEndpointRef> outputEndpoint;
  pool_ptr<soul::AST::OutputEndpointRef> outputEndpoint_1;
  pool_ptr<soul::AST::ArrayElementRef> local_90;
  ArrayView<soul::Type> local_88;
  pool_ptr<soul::AST::OutputEndpointRef> local_70;
  pool_ptr<soul::AST::Expression> local_68;
  pool_ref<soul::AST::Expression> local_60;
  pool_ref<soul::AST::Expression> local_58;
  CompileMessage local_50;
  
  ASTVisitor::visit(&this->super_ASTVisitor,w);
  throwErrorIfNotReadableValue((w->value).object);
  pWVar2 = ASTUtilities::getTopLevelWriteToEndpoint(w);
  local_58.object = (pWVar2->target).object;
  cast<soul::AST::OutputEndpointRef,soul::AST::Expression>((soul *)&local_90,&local_58);
  if (local_90.object != (ArrayElementRef *)0x0) {
    pOVar3 = pool_ptr<soul::AST::OutputEndpointRef>::operator->
                       ((pool_ptr<soul::AST::OutputEndpointRef> *)&local_90);
    iVar1 = (*(pOVar3->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])(pOVar3)
    ;
    if ((char)iVar1 == '\0') {
      return;
    }
    pOVar3 = pool_ptr<soul::AST::OutputEndpointRef>::operator->
                       ((pool_ptr<soul::AST::OutputEndpointRef> *)&local_90);
    pEVar4 = pool_ptr<soul::AST::EndpointDetails>::operator*(&((pOVar3->output).object)->details);
    AST::EndpointDetails::getSampleArrayTypes
              ((vector<soul::Type,_std::allocator<soul::Type>_> *)&local_88,pEVar4);
    expectSilentCastPossible
              (&(w->super_Expression).super_Statement.super_ASTObject.context,local_88,
               (w->value).object);
LAB_00253002:
    std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector
              ((vector<soul::Type,_std::allocator<soul::Type>_> *)&local_88);
    return;
  }
  local_60.object = (pWVar2->target).object;
  cast<soul::AST::ArrayElementRef,soul::AST::Expression>((soul *)&local_90,&local_60);
  if (local_90.object != (ArrayElementRef *)0x0) {
    pAVar5 = pool_ptr<soul::AST::ArrayElementRef>::operator->(&local_90);
    local_68.object = (pAVar5->object).object;
    cast<soul::AST::OutputEndpointRef,soul::AST::Expression>((soul *)&local_70,&local_68);
    if (local_70.object != (OutputEndpointRef *)0x0) {
      pOVar3 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&local_70);
      iVar1 = (*(pOVar3->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])
                        (pOVar3);
      if ((char)iVar1 == '\0') {
        return;
      }
      pOVar3 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&local_70);
      pEVar4 = pool_ptr<soul::AST::EndpointDetails>::operator*(&((pOVar3->output).object)->details);
      AST::EndpointDetails::getResolvedDataTypes
                ((vector<soul::Type,_std::allocator<soul::Type>_> *)&local_88,pEVar4);
      expectSilentCastPossible
                (&(w->super_Expression).super_Statement.super_ASTObject.context,local_88,
                 (w->value).object);
      goto LAB_00253002;
    }
  }
  Errors::targetMustBeOutput<>();
  AST::Context::throwError
            (&(w->super_Expression).super_Statement.super_ASTObject.context,&local_50,false);
}

Assistant:

void visit (AST::WriteToEndpoint& w) override
        {
            super::visit (w);

            throwErrorIfNotReadableValue (w.value);
            auto& topLevelWrite = ASTUtilities::getTopLevelWriteToEndpoint (w);

            // Either an OutputEndpointRef, or an ArrayElementRef of an OutputEndpointRef
            if (auto outputEndpoint = cast<AST::OutputEndpointRef> (topLevelWrite.target))
            {
                if (outputEndpoint->isResolved())
                    expectSilentCastPossible (w.context, outputEndpoint->output->getDetails().getSampleArrayTypes(), w.value);

                return;
            }

            if (auto arraySubscript = cast<AST::ArrayElementRef> (topLevelWrite.target))
            {
                if (auto outputEndpoint = cast<AST::OutputEndpointRef> (arraySubscript->object))
                {
                    if (outputEndpoint->isResolved())
                        expectSilentCastPossible (w.context, outputEndpoint->output->getDetails().getResolvedDataTypes(), w.value);

                    return;
                }
            }

            w.context.throwError (Errors::targetMustBeOutput());
            return;
        }